

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

IceTBoolean icetMatrixInverse(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  double dVar1;
  double *pdVar2;
  undefined8 *puVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double local_128 [4];
  undefined8 local_108 [4];
  double local_e8 [25];
  
  pdVar2 = local_128;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      *(undefined8 *)((long)pdVar2 + lVar8) = *(undefined8 *)((long)matrix_in + lVar8 * 4);
    }
    for (lVar8 = 4; lVar8 != 8; lVar8 = lVar8 + 1) {
      pdVar2[lVar8] = 0.0;
    }
    local_108[lVar4 * 9] = 0x3ff0000000000000;
    pdVar2 = pdVar2 + 8;
    matrix_in = matrix_in + 1;
  }
  lVar4 = -3;
  pdVar2 = local_128;
  pdVar5 = local_e8;
  pdVar7 = pdVar2;
  pdVar9 = pdVar2;
  uVar10 = 0;
  while( true ) {
    if (uVar10 == 4) {
      puVar3 = local_108;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
          *(undefined8 *)((long)matrix_out + lVar8 * 4) = *(undefined8 *)((long)puVar3 + lVar8);
        }
        matrix_out = matrix_out + 1;
        puVar3 = puVar3 + 8;
      }
      return '\x01';
    }
    uVar11 = uVar10 & 0xffffffff;
    pdVar6 = pdVar5;
    for (lVar8 = lVar4; lVar12 = (long)(int)uVar11, lVar8 != 0; lVar8 = lVar8 + 1) {
      if (ABS(local_128[lVar12 * 8 + uVar10]) < ABS(*pdVar6)) {
        uVar11 = (ulong)((int)lVar8 + 4);
      }
      pdVar6 = pdVar6 + 8;
    }
    if ((local_128[lVar12 * 8 + uVar10] == 0.0) && (!NAN(local_128[lVar12 * 8 + uVar10]))) break;
    if (uVar10 != uVar11) {
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        dVar1 = pdVar9[lVar8];
        pdVar9[lVar8] = local_128[lVar12 * 8 + lVar8];
        local_128[lVar12 * 8 + lVar8] = dVar1;
      }
    }
    dVar1 = local_128[uVar10 * 9];
    for (lVar8 = -8; uVar10 + lVar8 != 0; lVar8 = lVar8 + 1) {
      pdVar7[lVar8 + 8] = pdVar7[lVar8 + 8] * (1.0 / dVar1);
    }
    pdVar6 = pdVar2;
    for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
      if (uVar11 != uVar10) {
        dVar1 = local_128[uVar11 * 8 + uVar10];
        for (lVar8 = -8; uVar10 + lVar8 != 0; lVar8 = lVar8 + 1) {
          pdVar6[lVar8 + 8] = pdVar7[lVar8 + 8] * -dVar1 + pdVar6[lVar8 + 8];
        }
      }
      pdVar6 = pdVar6 + 8;
    }
    lVar4 = lVar4 + 1;
    pdVar5 = pdVar5 + 9;
    pdVar9 = pdVar9 + 8;
    pdVar7 = pdVar7 + 9;
    pdVar2 = pdVar2 + 1;
    uVar10 = uVar10 + 1;
  }
  return '\0';
}

Assistant:

IceTBoolean icetMatrixInverse(const IceTDouble *matrix_in,
                              IceTDouble *matrix_out)
{
    /* A 4x8 matrix we will do operations on.  The matrix starts as matrix_in
     * adjoined with the identity matrix.  We then do Gaussian elimination and
     * back substitution on the matrix that will result with the identity matrix
     * adjoined with the inverse of the original matrix. */
    IceTDouble matrix[4][8];
    int eliminationIdx;
    int rowIdx;

    /* Initialize the matrix. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        /* Left half is equal to matrix_in. */
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            matrix[rowIdx][columnIdx] = MAT(matrix_in, rowIdx, columnIdx);
        }
        /* Right half is the identity matrix. */
        for (columnIdx = 4; columnIdx < 8; columnIdx++) {
            matrix[rowIdx][columnIdx] = 0.0;
        }
        matrix[rowIdx][rowIdx+4] = 1.0;
    }

    /* Per the Gaussian elimination algorithm, starting at the top row make
     * the leftmost value 1 and zero out the column on all lower rows.  Repeat
     * to rows on down.  If a column will all remaining zeros is encountered,
     * no inverse exists so return failure. */
    for (eliminationIdx = 0; eliminationIdx < 4; eliminationIdx++)
    {
        int pivotIdx;
        int columnIdx;
        IceTDouble scale_value;

        /* Choose the pivot row as the one with the highest absolute value in
         * the elimination column. */
        pivotIdx = eliminationIdx;
        for (rowIdx = eliminationIdx+1; rowIdx < 4; rowIdx++) {
            if (  fabs(matrix[pivotIdx][eliminationIdx])
                < fabs(matrix[rowIdx][eliminationIdx]) ) {
                pivotIdx = rowIdx;
            }
        }

        /* If the entry in pivotIdx is 0, then all the values in the column must
         * be zero and no inverse exists. */
        if (matrix[pivotIdx][eliminationIdx] == 0.0) return ICET_FALSE;

        /* Swap the elimination row with the pivot row to make the pivot row the
         * elimination row. */
        if (pivotIdx != eliminationIdx) {
            for (columnIdx = 0; columnIdx < 8; columnIdx++) {
                IceTDouble old_elim_value = matrix[eliminationIdx][columnIdx];
                matrix[eliminationIdx][columnIdx] = matrix[pivotIdx][columnIdx];
                matrix[pivotIdx][columnIdx] = old_elim_value;
            }
        }

        /* Size the elimination row to scale the eliminationIdx column to 1. */
        scale_value = 1.0/matrix[eliminationIdx][eliminationIdx];
        for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
            matrix[eliminationIdx][columnIdx] *= scale_value;
        }

        /* Add a multiple of the elimination row to all other rows to zero out
         * that column of values.  Note that this is also doing back-propagation
         * as it is zeroing out values above. */
        for (rowIdx = 0; rowIdx < 4; rowIdx++) {
            if (rowIdx == eliminationIdx) continue;
            scale_value = -matrix[rowIdx][eliminationIdx];
            for (columnIdx = eliminationIdx; columnIdx < 8; columnIdx++) {
                matrix[rowIdx][columnIdx]
                    += scale_value*matrix[eliminationIdx][columnIdx];
            }
        }
    }

    /* At this point, the left 4x4 submatrix of matrix should be the identity
     * matrix and the right 4x4 submatrix is the inverse of matrix_in.  Copy the
     * result to matrix_out. */
    for (rowIdx = 0; rowIdx < 4; rowIdx++) {
        int columnIdx;
        for (columnIdx = 0; columnIdx < 4; columnIdx++) {
            MAT(matrix_out, rowIdx, columnIdx) = matrix[rowIdx][columnIdx+4];
        }
    }

    return ICET_TRUE;
}